

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmsh_reader.cc
# Opt level: O0

string * __thiscall
lf::io::GmshReader::PhysicalEntityNr2Name_abi_cxx11_
          (string *__return_storage_ptr__,GmshReader *this,size_type number,dim_t codim)

{
  bool bVar1;
  reference ppVar2;
  LfException *pLVar3;
  pointer ppVar4;
  byte local_239;
  string local_210;
  string local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  undefined1 local_149;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined4 local_e4;
  undefined1 local_e0 [8];
  pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  result;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  type *local_40;
  type *end;
  type *begin;
  uint local_20;
  size_type local_1c;
  dim_t codim_local;
  size_type number_local;
  GmshReader *this_local;
  
  local_20 = codim;
  local_1c = number;
  _codim_local = this;
  this_local = (GmshReader *)__return_storage_ptr__;
  _begin = std::
           multimap<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
           ::equal_range(&this->nr_2_name_,&local_1c);
  end = std::
        get<0ul,std::_Rb_tree_const_iterator<std::pair<unsigned_int_const,std::pair<std::__cxx11::string,unsigned_int>>>,std::_Rb_tree_const_iterator<std::pair<unsigned_int_const,std::pair<std::__cxx11::string,unsigned_int>>>>
                  ((pair<std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                    *)&begin);
  local_40 = std::
             get<1ul,std::_Rb_tree_const_iterator<std::pair<unsigned_int_const,std::pair<std::__cxx11::string,unsigned_int>>>,std::_Rb_tree_const_iterator<std::pair<unsigned_int_const,std::pair<std::__cxx11::string,unsigned_int>>>>
                       ((pair<std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                         *)&begin);
  bVar1 = std::operator==(end,local_40);
  if (bVar1) {
    result.second.second._3_1_ = 1;
    pLVar3 = (LfException *)__cxa_allocate_exception(0x28);
    std::__cxx11::to_string(&local_a0,local_1c);
    std::operator+(&local_80,"Physical entity with number ",&local_a0);
    std::operator+(&local_60,&local_80," not found.");
    lf::base::LfException::LfException(pLVar3,&local_60);
    result.second.second._3_1_ = 0;
    __cxa_throw(pLVar3,&lf::base::LfException::typeinfo,lf::base::LfException::~LfException);
  }
  ppVar2 = std::
           _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator*(end);
  std::
  pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::pair((pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
          *)local_e0,ppVar2);
  std::
  _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::operator++(end);
  bVar1 = std::operator==(end,local_40);
  if (bVar1) {
    if ((local_20 != 0xffffffff) && (result.second.first.field_2._8_4_ != local_20)) {
LAB_00161baa:
      pLVar3 = (LfException *)__cxa_allocate_exception(0x28);
      std::__cxx11::to_string(&local_1f0,local_1c);
      std::operator+(&local_1d0,"Physical entity with number=",&local_1f0);
      std::operator+(&local_1b0,&local_1d0,", codim=");
      std::__cxx11::to_string(&local_210,local_20);
      std::operator+(&local_190,&local_1b0,&local_210);
      std::operator+(&local_170,&local_190," not found.");
      lf::base::LfException::LfException(pLVar3,&local_170);
      __cxa_throw(pLVar3,&lf::base::LfException::typeinfo,lf::base::LfException::~LfException);
    }
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result);
  }
  else {
    if (local_20 == 0xffffffff) {
      local_149 = 1;
      pLVar3 = (LfException *)__cxa_allocate_exception(0x28);
      std::__cxx11::to_string(&local_148,local_1c);
      std::operator+(&local_128,"There are multiple physical entities with the Number ",&local_148);
      std::operator+(&local_108,&local_128,", please specify also the codimension");
      lf::base::LfException::LfException(pLVar3,&local_108);
      local_149 = 0;
      __cxa_throw(pLVar3,&lf::base::LfException::typeinfo,lf::base::LfException::~LfException);
    }
    if (result.second.first.field_2._8_4_ == local_20) {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result);
    }
    else {
      while( true ) {
        ppVar4 = std::
                 _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ::operator->(end);
        local_239 = 0;
        if ((ppVar4->second).second != local_20) {
          bVar1 = std::operator==(end,local_40);
          local_239 = bVar1 ^ 0xff;
        }
        if ((local_239 & 1) == 0) break;
        std::
        _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
        ::operator++(end);
      }
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator->(end);
      if ((ppVar4->second).second != local_20) goto LAB_00161baa;
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator->(end);
      std::__cxx11::string::string((string *)__return_storage_ptr__,&(ppVar4->second).first);
    }
  }
  local_e4 = 1;
  std::
  pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::~pair((pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
           *)local_e0);
  return __return_storage_ptr__;
}

Assistant:

std::string GmshReader::PhysicalEntityNr2Name(size_type number,
                                              dim_t codim) const {
  auto [begin, end] = nr_2_name_.equal_range(number);  // NOLINT
  if (begin == end) {
    throw base::LfException("Physical entity with number " +
                            std::to_string(number) + " not found.");
  }
  auto result = *begin;
  ++begin;
  if (begin == end) {
    if (codim == static_cast<dim_t>(-1) || result.second.second == codim) {
      return result.second.first;
    }
  } else {
    if (codim == static_cast<dim_t>(-1)) {
      throw base::LfException(
          "There are multiple physical entities with the Number " +
          std::to_string(number) + ", please specify also the codimension");
    }
    if (result.second.second == codim) {
      return result.second.first;
    }
    while (begin->second.second != codim && begin != end) {
      ++begin;
    }
    if (begin->second.second == codim) {
      return begin->second.first;
    }
  }
  throw base::LfException(
      "Physical entity with number=" + std::to_string(number) +
      ", codim=" + std::to_string(codim) + " not found.");
}